

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

void __thiscall fasttext::Vector::addRow(Vector *this,Matrix *A,int64_t i)

{
  pointer pfVar1;
  pointer pfVar2;
  long lVar3;
  long lVar4;
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/vector.cc"
                  ,0x40,"void fasttext::Vector::addRow(const Matrix &, int64_t)");
  }
  if (i < A->m_) {
    pfVar1 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar1 >> 2;
    if (lVar3 == A->n_) {
      if (0 < lVar3) {
        pfVar2 = (A->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar4 = 0;
        do {
          pfVar1[lVar4] = pfVar2[i * lVar3 + lVar4] + pfVar1[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar3 != lVar4);
      }
      return;
    }
    __assert_fail("size() == A.size(1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/vector.cc"
                  ,0x42,"void fasttext::Vector::addRow(const Matrix &, int64_t)");
  }
  __assert_fail("i < A.size(0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/vector.cc"
                ,0x41,"void fasttext::Vector::addRow(const Matrix &, int64_t)");
}

Assistant:

void Vector::addRow(const Matrix& A, int64_t i) {
  assert(i >= 0);
  assert(i < A.size(0));
  assert(size() == A.size(1));
  for (int64_t j = 0; j < A.size(1); j++) {
    data_[j] += A.at(i, j);
  }
}